

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O2

bool __thiscall
lsim::Simulator::component_has_function
          (Simulator *this,ComponentType comp_type,SimFuncType func_type)

{
  if (0x401 < comp_type) {
    __assert_fail("comp_type <= COMPONENT_MAX_TYPE_ID",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                  ,0x111,"bool lsim::Simulator::component_has_function(ComponentType, SimFuncType)")
    ;
  }
  if (func_type < 4) {
    return (this->m_sim_functions).
           super__Vector_base<std::array<std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>,_3UL>,_std::allocator<std::array<std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>,_3UL>_>_>
           ._M_impl.super__Vector_impl_data._M_start[comp_type]._M_elems[func_type].
           super__Function_base._M_manager != (_Manager_type)0x0;
  }
  __assert_fail("func_type <= 3",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                ,0x112,"bool lsim::Simulator::component_has_function(ComponentType, SimFuncType)");
}

Assistant:

bool Simulator::component_has_function(ComponentType comp_type, SimFuncType func_type) {
    assert(comp_type <= COMPONENT_MAX_TYPE_ID);
    assert(func_type <= 3);
    return m_sim_functions[comp_type][func_type] != nullptr;
}